

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

int katherine_set_seq_readout_start(katherine_device_t *device,int arg)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 local_20;
  
  iVar2 = katherine_udp_mutex_lock(&device->control_socket);
  if (iVar2 == 0) {
    local_20 = 0x5000000000000;
    if (0 < arg) {
      puVar3 = &local_20;
      uVar4 = (ulong)(uint)arg;
      do {
        *(char *)puVar3 = (char)uVar4;
        puVar3 = (undefined8 *)((long)puVar3 + 1);
        bVar1 = 0xff < uVar4;
        uVar4 = uVar4 >> 8;
      } while (bVar1);
    }
    iVar2 = katherine_udp_send_exact(&device->control_socket,&local_20,8);
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  return iVar2;
}

Assistant:

int
katherine_set_seq_readout_start(katherine_device_t *device, int arg)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    res = katherine_cmd_set_seq_readout_start(&device->control_socket, arg);
    if (res) goto err;

    /* Note: this command does _not_ produce an acknowledgement. */

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}